

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastDividerSigned
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,Vec_Int_t *vRes)

{
  int *pDiv_00;
  int *pNum_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iData0;
  int iVar4;
  Vec_Int_t *vRes_00;
  Vec_Int_t *vRes_01;
  Vec_Int_t *vRes_02;
  Vec_Int_t *vRes_03;
  Vec_Int_t *vRes_04;
  Vec_Int_t *vRes_05;
  Vec_Int_t *vRes_06;
  int iVar5;
  int iVar6;
  
  vRes_00 = Vec_IntAlloc(nNum);
  vRes_01 = Vec_IntAlloc(nDiv);
  iVar5 = nDiv + nNum;
  vRes_02 = Vec_IntAlloc(iVar5);
  vRes_03 = Vec_IntAlloc(iVar5);
  vRes_04 = Vec_IntAlloc(iVar5);
  vRes_05 = Vec_IntAlloc(iVar5);
  vRes_06 = Vec_IntAlloc(nNum);
  iVar1 = Gia_ManHashXor(pNew,pNum[(long)nNum + -1],pDiv[(long)nDiv + -1]);
  Wlc_BlastMinus(pNew,pNum,nNum,vRes_00);
  Wlc_BlastMinus(pNew,pDiv,nDiv,vRes_01);
  Wlc_BlastDivider(pNew,pNum,nNum,pDiv,nDiv,fQuo,vRes_02);
  pDiv_00 = vRes_01->pArray;
  Wlc_BlastDivider(pNew,pNum,nNum,pDiv_00,nDiv,fQuo,vRes_03);
  pNum_00 = vRes_00->pArray;
  Wlc_BlastDivider(pNew,pNum_00,nNum,pDiv,nDiv,fQuo,vRes_04);
  Wlc_BlastDivider(pNew,pNum_00,nNum,pDiv_00,nDiv,fQuo,vRes_05);
  vRes->nSize = 0;
  iVar6 = 0;
  iVar5 = 0;
  if (0 < nNum) {
    iVar5 = nNum;
  }
  for (; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    iVar4 = pDiv[(long)nDiv + -1];
    iVar2 = Vec_IntEntry(vRes_03,iVar6);
    iVar3 = Vec_IntEntry(vRes_02,iVar6);
    iVar2 = Gia_ManHashMux(pNew,iVar4,iVar2,iVar3);
    iVar4 = pDiv[(long)nDiv + -1];
    iVar3 = Vec_IntEntry(vRes_05,iVar6);
    iData0 = Vec_IntEntry(vRes_04,iVar6);
    iVar4 = Gia_ManHashMux(pNew,iVar4,iVar3,iData0);
    iVar4 = Gia_ManHashMux(pNew,pNum[(long)nNum + -1],iVar4,iVar2);
    Vec_IntPush(vRes,iVar4);
  }
  Wlc_BlastMinus(pNew,vRes->pArray,nNum,vRes_06);
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    iVar4 = iVar1;
    if (fQuo == 0) {
      iVar4 = pNum[(long)nNum + -1];
    }
    iVar2 = Vec_IntEntry(vRes_06,iVar6);
    iVar3 = Vec_IntEntry(vRes,iVar6);
    iVar4 = Gia_ManHashMux(pNew,iVar4,iVar2,iVar3);
    Vec_IntWriteEntry(vRes,iVar6,iVar4);
  }
  Vec_IntFree(vRes_00);
  Vec_IntFree(vRes_01);
  Vec_IntFree(vRes_02);
  Vec_IntFree(vRes_03);
  Vec_IntFree(vRes_04);
  Vec_IntFree(vRes_05);
  Vec_IntFree(vRes_06);
  if (vRes->nSize != nNum) {
    __assert_fail("Vec_IntSize(vRes) == nNum",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x217,
                  "void Wlc_BlastDividerSigned(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)"
                 );
  }
  return;
}

Assistant:

void Wlc_BlastDividerSigned( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    Vec_Int_t * vNum   = Vec_IntAlloc( nNum );
    Vec_Int_t * vDiv   = Vec_IntAlloc( nDiv );
    Vec_Int_t * vRes00 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes01 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes10 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes11 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes2  = Vec_IntAlloc( nNum );
    int k, iDiffSign   = Gia_ManHashXor( pNew, pNum[nNum-1], pDiv[nDiv-1] );
    Wlc_BlastMinus( pNew, pNum, nNum, vNum );
    Wlc_BlastMinus( pNew, pDiv, nDiv, vDiv );
    Wlc_BlastDivider( pNew,               pNum, nNum,               pDiv, nDiv, fQuo, vRes00 );
    Wlc_BlastDivider( pNew,               pNum, nNum, Vec_IntArray(vDiv), nDiv, fQuo, vRes01 );
    Wlc_BlastDivider( pNew, Vec_IntArray(vNum), nNum,               pDiv, nDiv, fQuo, vRes10 );
    Wlc_BlastDivider( pNew, Vec_IntArray(vNum), nNum, Vec_IntArray(vDiv), nDiv, fQuo, vRes11 );
    Vec_IntClear( vRes );
    for ( k = 0; k < nNum; k++ )
    {
        int Data0 =  Gia_ManHashMux( pNew, pDiv[nDiv-1], Vec_IntEntry(vRes01,k), Vec_IntEntry(vRes00,k) );
        int Data1 =  Gia_ManHashMux( pNew, pDiv[nDiv-1], Vec_IntEntry(vRes11,k), Vec_IntEntry(vRes10,k) );
        Vec_IntPush( vRes, Gia_ManHashMux(pNew, pNum[nNum-1], Data1, Data0) );
    }
    Wlc_BlastMinus( pNew, Vec_IntArray(vRes), nNum, vRes2 );
    for ( k = 0; k < nNum; k++ )
        Vec_IntWriteEntry( vRes, k, Gia_ManHashMux(pNew, fQuo ? iDiffSign : pNum[nNum-1], Vec_IntEntry(vRes2,k), Vec_IntEntry(vRes,k)) );
    Vec_IntFree( vNum );
    Vec_IntFree( vDiv );
    Vec_IntFree( vRes00 );
    Vec_IntFree( vRes01 );
    Vec_IntFree( vRes10 );
    Vec_IntFree( vRes11 );
    Vec_IntFree( vRes2 );
    assert( Vec_IntSize(vRes) == nNum );
}